

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Signal_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Signal_PDU *this)

{
  ostream *poVar1;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Signal_PDU *local_18;
  Signal_PDU *this_local;
  
  local_18 = this;
  this_local = (Signal_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Signal PDU-\n");
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Radio_Communications_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  DATA_TYPE::EncodingScheme::GetAsString_abi_cxx11_(&local_210,&this->m_EncodingScheme);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Sample Rate:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32SampleRate);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Data Length:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16DataLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Samples:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Samples);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Signal_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Signal PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << m_EncodingScheme.GetAsString()
       << "Sample Rate:     " << m_ui32SampleRate << "\n"
       << "Data Length:     " << m_ui16DataLength << "\n"
       << "Samples:         " << m_ui16Samples    << "\n";

    // Data is not printed as we don't know how to interpret the data.
    // You could create a derived class and override the GetAsString
    // if you wanted to interpret a particular type of data.

    return ss.str();
}